

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t
exr_start_write(exr_context_t *ctxt,char *filename,exr_default_write_mode_t default_mode,
               exr_context_initializer_t *ctxtdata)

{
  exr_result_t eVar1;
  int in_EDX;
  char *in_RSI;
  undefined8 *in_RDI;
  exr_context_initializer_t inits;
  exr_context_t ret;
  int rv;
  exr_context_initializer_t *in_stack_ffffffffffffff60;
  exr_context_t *in_stack_ffffffffffffff68;
  exr_attr_string_t *in_stack_ffffffffffffff70;
  exr_context_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff90;
  undefined4 local_68;
  _INTERNAL_EXR_CONTEXT_MODE in_stack_ffffffffffffff9c;
  exr_context_initializer_t *in_stack_ffffffffffffffa0;
  exr_context_t *in_stack_ffffffffffffffa8;
  exr_context_t in_stack_ffffffffffffffb8;
  exr_result_t local_2c;
  exr_result_t local_4;
  
  fill_context_data(in_stack_ffffffffffffff60);
  if (in_RDI == (undefined8 *)0x0) {
    (*(code *)in_stack_ffffffffffffff68)(0,3,"Invalid context handle passed to start_read function")
    ;
    local_4 = 3;
  }
  else {
    if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
      (*(code *)in_stack_ffffffffffffff68)(0,3,"Invalid filename passed to start_write function");
      local_2c = 3;
    }
    else {
      eVar1 = internal_exr_alloc_context
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
      if (eVar1 == 0) {
        pcRam0000000000000030 = dispatch_write;
        local_2c = exr_attr_string_create
                             (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                              (char *)in_stack_ffffffffffffff68);
        if ((local_2c == 0) && (CONCAT44(in_stack_ffffffffffffff9c,local_68) == 0)) {
          if (in_EDX == 1) {
            local_2c = make_temp_filename(in_stack_ffffffffffffffb8);
          }
          if (local_2c == 0) {
            local_2c = default_init_write_file(in_stack_ffffffffffffff78);
          }
        }
        if (local_2c != 0) {
          exr_finish(in_stack_ffffffffffffff68);
        }
      }
      else {
        local_2c = 1;
      }
    }
    *in_RDI = 0;
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_start_write (
    exr_context_t*                   ctxt,
    const char*                      filename,
    exr_default_write_mode_t         default_mode,
    const exr_context_initializer_t* ctxtdata)
{
    int                       rv    = EXR_ERR_UNKNOWN;
    exr_context_t             ret   = NULL;
    exr_context_initializer_t inits = fill_context_data (ctxtdata);

    if (!ctxt)
    {
        inits.error_handler_fn (
            NULL,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid context handle passed to start_read function");
        return EXR_ERR_INVALID_ARGUMENT;
    }

    if (filename && filename[0] != '\0')
    {
        rv = internal_exr_alloc_context (
            &ret,
            &inits,
            EXR_CONTEXT_WRITE,
            sizeof (struct _internal_exr_filehandle));
        if (rv == EXR_ERR_SUCCESS)
        {
            ret->do_write = &dispatch_write;

            rv = exr_attr_string_create (
                (exr_context_t) ret, &(ret->filename), filename);

            if (rv == EXR_ERR_SUCCESS)
            {
                if (!inits.write_fn)
                {
                    if (default_mode == EXR_INTERMEDIATE_TEMP_FILE)
                        rv = make_temp_filename (ret);
                    if (rv == EXR_ERR_SUCCESS)
                        rv = default_init_write_file (ret);
                }
            }

            if (rv != EXR_ERR_SUCCESS) exr_finish ((exr_context_t*) &ret);
        }
        else
            rv = EXR_ERR_OUT_OF_MEMORY;
    }
    else
    {
        inits.error_handler_fn (
            NULL,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid filename passed to start_write function");
        rv = EXR_ERR_INVALID_ARGUMENT;
    }

    *ctxt = (exr_context_t) ret;
    return rv;
}